

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::planeSplit(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                   *obj,unsigned_long *ind,unsigned_long count,int cutfeat,DistanceType *cutval,
            unsigned_long *lim1,unsigned_long *lim2)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  ElementType EVar6;
  
  uVar3 = count - 1;
  uVar2 = 0;
  uVar4 = uVar3;
LAB_001c1268:
  do {
    if (uVar2 <= uVar4) {
      EVar6 = dataset_get(this,obj,ind[uVar2],cutfeat);
      if (EVar6 < *cutval) {
        uVar2 = uVar2 + 1;
        goto LAB_001c1268;
      }
    }
    while( true ) {
      bVar5 = uVar4 != 0;
      if ((uVar4 < uVar2) || (uVar4 == 0)) goto LAB_001c12c7;
      EVar6 = dataset_get(this,obj,ind[uVar4],cutfeat);
      if (EVar6 < *cutval) break;
      uVar4 = uVar4 - 1;
    }
    bVar5 = true;
LAB_001c12c7:
    if ((uVar4 < uVar2) || (!bVar5)) break;
    uVar1 = ind[uVar2];
    ind[uVar2] = ind[uVar4];
    ind[uVar4] = uVar1;
    uVar2 = uVar2 + 1;
    uVar4 = uVar4 - 1;
  } while( true );
  *lim1 = uVar2;
LAB_001c12f0:
  do {
    if (uVar2 <= uVar3) {
      EVar6 = dataset_get(this,obj,ind[uVar2],cutfeat);
      if (EVar6 <= *cutval) {
        uVar2 = uVar2 + 1;
        goto LAB_001c12f0;
      }
    }
    while( true ) {
      bVar5 = uVar3 != 0;
      if ((uVar3 < uVar2) || (uVar3 == 0)) goto LAB_001c134f;
      EVar6 = dataset_get(this,obj,ind[uVar3],cutfeat);
      if (EVar6 < *cutval || EVar6 == *cutval) break;
      uVar3 = uVar3 - 1;
    }
    bVar5 = true;
LAB_001c134f:
    if ((uVar3 < uVar2) || (!bVar5)) {
      *lim2 = uVar2;
      return;
    }
    uVar1 = ind[uVar2];
    ind[uVar2] = ind[uVar3];
    ind[uVar3] = uVar1;
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 - 1;
  } while( true );
}

Assistant:

void planeSplit(Derived &obj, IndexType *ind, const IndexType count,
                  int cutfeat, DistanceType &cutval, IndexType &lim1,
                  IndexType &lim2) {
    /* Move vector indices for left subtree to front of list. */
    IndexType left = 0;
    IndexType right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) < cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) >= cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    /* If either list is empty, it means that all remaining features
     * are identical. Split in the middle to maintain a balanced tree.
     */
    lim1 = left;
    right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) <= cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) > cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    lim2 = left;
  }